

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

string * __thiscall
duckdb::Date::ToString_abi_cxx11_(string *__return_storage_ptr__,Date *this,date_t date)

{
  int32_t year;
  char *pcVar1;
  allocator *paVar2;
  date_t d;
  ulong uVar3;
  idx_t year_length;
  allocator local_3e;
  allocator local_3d;
  int local_3c;
  int32_t local_38;
  int32_t local_34;
  
  d.days = (int32_t)this;
  if (d.days == -0x7fffffff) {
    paVar2 = &local_3e;
    pcVar1 = NINF;
  }
  else {
    if (d.days != 0x7fffffff) {
      Convert(d,&local_3c,&local_38,&local_34);
      year = 1 - local_3c;
      if (0 < local_3c) {
        year = local_3c;
      }
      year_length = (ulong)(9999999 < year) +
                    (ulong)(999999 < year) + (ulong)(99999 < year) + (ulong)(9999 < year) + 4;
      uVar3 = (ulong)(local_3c < 1) * 5 + year_length + 6;
      pcVar1 = (char *)operator_new__(uVar3);
      DateToStringCast::Format(pcVar1,year,local_38,local_34,year_length,local_3c < 1);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar3);
      operator_delete__(pcVar1);
      return __return_storage_ptr__;
    }
    paVar2 = &local_3d;
    pcVar1 = PINF;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,paVar2);
  return __return_storage_ptr__;
}

Assistant:

string Date::ToString(date_t date) {
	// PG displays temporal infinities in lowercase,
	// but numerics in Titlecase.
	if (date == date_t::infinity()) {
		return PINF;
	} else if (date == date_t::ninfinity()) {
		return NINF;
	}
	int32_t date_units[3];
	idx_t year_length;
	bool add_bc;
	Date::Convert(date, date_units[0], date_units[1], date_units[2]);

	auto length = DateToStringCast::Length(date_units, year_length, add_bc);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(length);
	DateToStringCast::Format(buffer.get(), date_units, year_length, add_bc);
	return string(buffer.get(), length);
}